

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t linear_hash_get_record
                    (ion_fpos_t loc,ion_byte_t *key,ion_byte_t *value,ion_byte_t *status,
                    linear_hash_table_t *linear_hash)

{
  FILE *__stream;
  long lVar1;
  ion_byte_t *piVar2;
  int iVar3;
  size_t sVar4;
  undefined1 *puVar5;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  undefined1 *local_40;
  ion_byte_t *record;
  linear_hash_table_t *linear_hash_local;
  ion_byte_t *status_local;
  ion_byte_t *value_local;
  ion_byte_t *key_local;
  ion_fpos_t loc_local;
  
  uStack_50 = 0x112fef;
  record = (ion_byte_t *)linear_hash;
  linear_hash_local = (linear_hash_table_t *)status;
  status_local = value;
  value_local = key;
  key_local = (ion_byte_t *)loc;
  iVar3 = fseek((FILE *)linear_hash->database,loc,0);
  if (iVar3 == 0) {
    lVar1 = -(*(long *)(record + 0x40) + 0xfU & 0xfffffffffffffff0);
    sVar4 = *(size_t *)(record + 0x40);
    __stream = *(FILE **)(record + 0x48);
    local_40 = auStack_48 + lVar1;
    *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x11303b;
    sVar4 = fread(auStack_48 + lVar1,sVar4,1,__stream);
    piVar2 = value_local;
    if (sVar4 == 1) {
      *(undefined1 *)&(linear_hash_local->super).key_type = *local_40;
      puVar5 = local_40 + 1;
      iVar3 = *(int *)(record + 4);
      *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x113073;
      memcpy(piVar2,puVar5,(long)iVar3);
      piVar2 = status_local;
      puVar5 = local_40 + (long)*(int *)(record + 4) + 1;
      iVar3 = *(int *)(record + 8);
      *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x113097;
      memcpy(piVar2,puVar5,(long)iVar3);
      loc_local._7_1_ = '\0';
    }
    else {
      loc_local._7_1_ = '\b';
    }
  }
  else {
    loc_local._7_1_ = '\r';
  }
  return loc_local._7_1_;
}

Assistant:

ion_err_t
linear_hash_get_record(
	ion_fpos_t			loc,
	ion_byte_t			*key,
	ion_byte_t			*value,
	ion_byte_t			*status,
	linear_hash_table_t *linear_hash
) {
	/* seek to location of record in file */
	if (0 != fseek(linear_hash->database, loc, SEEK_SET)) {
		return err_file_bad_seek;
	}

	/* cache record data from file */
	ion_byte_t *record = alloca(linear_hash->record_total_size);

	if (1 != fread(record, linear_hash->record_total_size, 1, linear_hash->database)) {
		return err_file_read_error;
	}

	/* read record data elements */
	memcpy(status, record, sizeof(*status));
	memcpy(key, record + sizeof(*status), linear_hash->super.record.key_size);
	memcpy(value, record + sizeof(*status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

	return err_ok;
}